

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall
SimpleString::split(SimpleString *this,SimpleString *delimiter,SimpleStringCollection *col)

{
  bool bVar1;
  size_t index;
  char *pcVar2;
  SimpleString *pSVar3;
  size_t index_00;
  char *otherBuffer;
  SimpleString local_50;
  SimpleString local_40;
  
  index = count(this,delimiter);
  bVar1 = endsWith(this,delimiter);
  SimpleStringCollection::allocate(col,!bVar1 + index);
  otherBuffer = this->buffer_;
  for (index_00 = 0; index != index_00; index_00 = index_00 + 1) {
    pcVar2 = StrStr(otherBuffer,delimiter->buffer_);
    SimpleString(&local_40,otherBuffer);
    subString(&local_50,(size_t)&local_40,0);
    pSVar3 = SimpleStringCollection::operator[](col,index_00);
    operator=(pSVar3,&local_50);
    ~SimpleString(&local_50);
    ~SimpleString(&local_40);
    otherBuffer = pcVar2 + 1;
  }
  if (!bVar1) {
    SimpleString(&local_50,otherBuffer);
    pSVar3 = SimpleStringCollection::operator[](col,index);
    operator=(pSVar3,&local_50);
    ~SimpleString(&local_50);
  }
  return;
}

Assistant:

void SimpleString::split(const SimpleString& delimiter, SimpleStringCollection& col) const
{
    size_t num = count(delimiter);
    size_t extraEndToken = (endsWith(delimiter)) ? 0 : 1U;
    col.allocate(num + extraEndToken);

    const char* str = getBuffer();
    const char* prev;
    for (size_t i = 0; i < num; ++i) {
        prev = str;
        str = StrStr(str, delimiter.getBuffer()) + 1;
        col[i] = SimpleString(prev).subString(0, size_t (str - prev));
    }
    if (extraEndToken) {
        col[num] = str;
    }
}